

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvref_common.c
# Opt level: O2

void av1_setup_frame_sign_bias(AV1_COMMON *cm)

{
  int iVar1;
  RefCntBuffer *pRVar2;
  uint uVar3;
  OrderHintInfo *oh;
  long lVar4;
  
  oh = &cm->seq_params->order_hint_info;
  for (lVar4 = 0x18da; lVar4 != 0x18e1; lVar4 = lVar4 + 1) {
    pRVar2 = get_ref_frame_buf(cm,(char)lVar4 + '\'');
    uVar3 = 0;
    if ((oh->enable_order_hint != 0) && (pRVar2 != (RefCntBuffer *)0x0)) {
      iVar1 = get_relative_dist(oh,pRVar2->order_hint,(cm->current_frame).order_hint);
      uVar3 = (uint)(0 < iVar1);
    }
    cm->buffer_removal_times[lVar4 + -0x15] = uVar3;
  }
  return;
}

Assistant:

void av1_setup_frame_sign_bias(AV1_COMMON *cm) {
  MV_REFERENCE_FRAME ref_frame;
  for (ref_frame = LAST_FRAME; ref_frame <= ALTREF_FRAME; ++ref_frame) {
    const RefCntBuffer *const buf = get_ref_frame_buf(cm, ref_frame);
    if (cm->seq_params->order_hint_info.enable_order_hint && buf != NULL) {
      const int ref_order_hint = buf->order_hint;
      cm->ref_frame_sign_bias[ref_frame] =
          (get_relative_dist(&cm->seq_params->order_hint_info, ref_order_hint,
                             (int)cm->current_frame.order_hint) <= 0)
              ? 0
              : 1;
    } else {
      cm->ref_frame_sign_bias[ref_frame] = 0;
    }
  }
}